

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
test::get_ts(vector<double,_std::allocator<double>_> *__return_storage_ptr__,test *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = this->n_gen;
  iVar2 = this->n_prompt;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  transform<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>,test::get_ts()const::_lambda(unsigned_long)_1_>
            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(this->samples_ns).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(this->samples_ns).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish,
             (back_insert_iterator<std::vector<double,_std::allocator<double>_>_>)
             __return_storage_ptr__,(anon_class_4_1_f85df009)(iVar1 + iVar2));
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> get_ts() const {
        int                 n_tokens = n_prompt + n_gen;
        std::vector<double> ts;
        std::transform(samples_ns.begin(), samples_ns.end(), std::back_inserter(ts),
                       [n_tokens](uint64_t t) { return 1e9 * n_tokens / t; });
        return ts;
    }